

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O3

int run_test_spawn_closed_process_io(void)

{
  int iVar1;
  __uid_t _Var2;
  uint file;
  uv_os_fd_t __fd;
  int iVar3;
  int extraout_EAX;
  int extraout_EAX_00;
  uv_loop_t *puVar4;
  uv_loop_t *puVar5;
  __sighandler_t p_Var6;
  uv_process_options_t *loop;
  passwd *ppVar7;
  uv_process_t *loop_00;
  uv_buf_t *buf;
  uv_fs_t *puVar8;
  anon_union_8_2_26168aa3_for_data aVar9;
  uv_stream_t *puVar10;
  uv_process_t *puVar11;
  code *req;
  uv_timer_t *puVar12;
  uv_process_options_t *loop_01;
  char *unaff_R15;
  uv_stdio_container_t stdio [2];
  uv_pipe_t in;
  uv_write_t write_req;
  undefined1 auStack_aa0 [8];
  uv_buf_t uStack_a98;
  uv_stdio_container_t uStack_a88;
  undefined4 uStack_a78;
  undefined4 uStack_a68;
  undefined1 auStack_a58 [704];
  uv_loop_t *puStack_798;
  uv_signal_cb p_Stack_790;
  int iStack_780;
  uv_os_fd_t uStack_77c;
  uv_buf_t uStack_778;
  char acStack_768 [16];
  uv_stdio_container_t uStack_758;
  uv_stream_t uStack_740;
  uv_fs_t uStack_638;
  uv_write_t uStack_480;
  uv_write_t uStack_3c0;
  uv_loop_t *puStack_300;
  uv_loop_t *puStack_2f8;
  char *pcStack_2f0;
  undefined1 auStack_2c4 [28];
  undefined1 auStack_290 [136];
  undefined1 local_208 [48];
  undefined1 local_1d8 [456];
  
  auStack_290._128_8_ = (void *)0x178771;
  init_process_options("spawn_helper3",exit_cb);
  auStack_290._128_8_ = (void *)0x178776;
  puVar4 = uv_default_loop();
  puVar5 = (uv_loop_t *)local_1d8;
  auStack_290._128_8_ = (void *)0x178788;
  uv_pipe_init(puVar4,(uv_pipe_t *)puVar5,0);
  options.stdio = (uv_stdio_container_t *)(local_208 + 0x10);
  loop_01 = &options;
  local_208._16_4_ = 0x11;
  options.stdio_count = 1;
  auStack_290._128_8_ = (void *)0x1787b6;
  local_208._24_8_ = puVar5;
  close(0);
  auStack_290._128_8_ = (void *)0x1787bb;
  puVar4 = uv_default_loop();
  auStack_290._128_8_ = (void *)0x1787cd;
  iVar1 = uv_spawn(puVar4,&process,&options);
  if (iVar1 == 0) {
    auStack_290._128_8_ = (void *)0x1787e6;
    local_208._0_16_ = (undefined1  [16])uv_buf_init(run_test_spawn_closed_process_io::buffer,0x18);
    auStack_290._128_8_ = (void *)0x178811;
    iVar1 = uv_write((uv_write_t *)(local_1d8 + 0x108),(uv_stream_t *)local_1d8,
                     (uv_buf_t *)local_208,1,write_cb);
    if (iVar1 != 0) goto LAB_00178885;
    auStack_290._128_8_ = (void *)0x17881a;
    puVar4 = uv_default_loop();
    auStack_290._128_8_ = (void *)0x178824;
    iVar1 = uv_run(puVar4,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_0017888a;
    if (exit_cb_called != 1) goto LAB_0017888f;
    if (close_cb_called != 2) goto LAB_00178894;
    auStack_290._128_8_ = (void *)0x17883f;
    puVar5 = uv_default_loop();
    auStack_290._128_8_ = (void *)0x178853;
    uv_walk(puVar5,close_walk_cb,(void *)0x0);
    auStack_290._128_8_ = (void *)0x17885d;
    uv_run(puVar5,UV_RUN_DEFAULT);
    auStack_290._128_8_ = (void *)0x178862;
    puVar4 = uv_default_loop();
    auStack_290._128_8_ = (void *)0x17886a;
    iVar1 = uv_loop_close(puVar4);
    if (iVar1 == 0) {
      auStack_290._128_8_ = (void *)0x178873;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    auStack_290._128_8_ = (void *)0x178885;
    run_test_spawn_closed_process_io_cold_1();
LAB_00178885:
    auStack_290._128_8_ = (void *)0x17888a;
    run_test_spawn_closed_process_io_cold_2();
LAB_0017888a:
    auStack_290._128_8_ = (void *)0x17888f;
    run_test_spawn_closed_process_io_cold_3();
LAB_0017888f:
    auStack_290._128_8_ = (void *)0x178894;
    run_test_spawn_closed_process_io_cold_4();
LAB_00178894:
    auStack_290._128_8_ = (void *)0x178899;
    run_test_spawn_closed_process_io_cold_5();
  }
  auStack_290._128_8_ = run_test_kill;
  run_test_spawn_closed_process_io_cold_6();
  loop = (uv_process_options_t *)auStack_290;
  auStack_290._128_8_ = puVar5;
  init_process_options("spawn_helper4",kill_cb);
  sigemptyset((sigset_t *)auStack_290);
  sigaddset((sigset_t *)auStack_290,0xf);
  iVar1 = pthread_sigmask(0,(__sigset_t *)auStack_290,(__sigset_t *)0x0);
  if (iVar1 == 0) {
    p_Var6 = signal(0xf,(__sighandler_t)0x1);
    if (p_Var6 == (__sighandler_t)0xffffffffffffffff) goto LAB_00178a01;
    puVar5 = uv_default_loop();
    iVar1 = uv_spawn(puVar5,&process,&options);
    if (iVar1 != 0) goto LAB_00178a06;
    sigemptyset((sigset_t *)auStack_290);
    sigaddset((sigset_t *)auStack_290,0xf);
    iVar1 = pthread_sigmask(1,(__sigset_t *)auStack_290,(__sigset_t *)0x0);
    if (iVar1 != 0) goto LAB_00178a0b;
    p_Var6 = signal(0xf,(__sighandler_t)0x0);
    if (p_Var6 == (__sighandler_t)0xffffffffffffffff) goto LAB_00178a10;
    iVar1 = uv_kill(process.pid,0);
    if (iVar1 != 0) goto LAB_00178a15;
    iVar1 = uv_kill(process.pid,0xf);
    if (iVar1 != 0) goto LAB_00178a1a;
    puVar5 = uv_default_loop();
    iVar1 = uv_run(puVar5,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_00178a1f;
    if (exit_cb_called != 1) goto LAB_00178a24;
    if (close_cb_called != 1) goto LAB_00178a29;
    loop = (uv_process_options_t *)uv_default_loop();
    uv_walk((uv_loop_t *)loop,close_walk_cb,(void *)0x0);
    uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
    puVar5 = uv_default_loop();
    iVar1 = uv_loop_close(puVar5);
    if (iVar1 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_kill_cold_1();
LAB_00178a01:
    run_test_kill_cold_11();
LAB_00178a06:
    run_test_kill_cold_2();
LAB_00178a0b:
    run_test_kill_cold_3();
LAB_00178a10:
    run_test_kill_cold_10();
LAB_00178a15:
    run_test_kill_cold_4();
LAB_00178a1a:
    run_test_kill_cold_5();
LAB_00178a1f:
    run_test_kill_cold_6();
LAB_00178a24:
    run_test_kill_cold_7();
LAB_00178a29:
    run_test_kill_cold_8();
  }
  run_test_kill_cold_9();
  auStack_2c4._20_8_ = loop;
  _Var2 = getuid();
  if (_Var2 != 0) {
    run_test_spawn_setuid_setgid_cold_1();
    return 1;
  }
  init_process_options("spawn_helper_setuid_setgid",exit_cb);
  ppVar7 = getpwnam("nobody");
  if (ppVar7 == (passwd *)0x0) {
    run_test_spawn_setuid_setgid_cold_8();
LAB_00178b93:
    run_test_spawn_setuid_setgid_cold_7();
LAB_00178b98:
    run_test_spawn_setuid_setgid_cold_2();
LAB_00178b9d:
    run_test_spawn_setuid_setgid_cold_3();
LAB_00178ba2:
    run_test_spawn_setuid_setgid_cold_4();
  }
  else {
    options.uid = ppVar7->pw_uid;
    loop = &options;
    options.gid = ppVar7->pw_gid;
    unaff_R15 = "%d";
    snprintf(auStack_2c4 + 10,10,"%d",(ulong)ppVar7->pw_uid);
    loop_01 = (uv_process_options_t *)auStack_2c4;
    snprintf((char *)loop_01,10,"%d",(ulong)ppVar7->pw_gid);
    options.args[2] = auStack_2c4 + 10;
    options.args[3] = (char *)loop_01;
    options.flags = 3;
    puVar5 = uv_default_loop();
    iVar1 = uv_spawn(puVar5,&process,&options);
    if (iVar1 != 0) {
      if (iVar1 == -0xd) {
        run_test_spawn_setuid_setgid_cold_6();
        return 1;
      }
      goto LAB_00178b93;
    }
    puVar5 = uv_default_loop();
    iVar1 = uv_run(puVar5,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_00178b98;
    if (exit_cb_called != 1) goto LAB_00178b9d;
    if (close_cb_called != 1) goto LAB_00178ba2;
    loop_01 = (uv_process_options_t *)uv_default_loop();
    loop = (uv_process_options_t *)0x0;
    uv_walk((uv_loop_t *)loop_01,close_walk_cb,(void *)0x0);
    uv_run((uv_loop_t *)loop_01,UV_RUN_DEFAULT);
    puVar5 = uv_default_loop();
    iVar1 = uv_loop_close(puVar5);
    if (iVar1 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  run_test_spawn_setuid_setgid_cold_5();
  _Var2 = getuid();
  if (_Var2 == 0) {
    puVar5 = (uv_loop_t *)getpwnam("nobody");
    if (puVar5 == (uv_loop_t *)0x0) goto LAB_00178ca2;
    iVar1 = setgid(*(__gid_t *)((long)puVar5->handle_queue + 4));
    loop = (uv_process_options_t *)puVar5;
    if (iVar1 != 0) goto LAB_00178ca7;
    iVar1 = setuid(*(__uid_t *)puVar5->handle_queue);
    if (iVar1 == 0) goto LAB_00178bee;
  }
  else {
LAB_00178bee:
    init_process_options("spawn_helper1",fail_cb);
    loop = &options;
    options.uid = 0;
    options.flags = options.flags | 0x75;
    puVar5 = uv_default_loop();
    iVar1 = uv_spawn(puVar5,&process,&options);
    if (iVar1 == -1) {
      puVar5 = uv_default_loop();
      iVar1 = uv_run(puVar5,UV_RUN_DEFAULT);
      if (iVar1 != 0) goto LAB_00178c93;
      if (close_cb_called != 0) goto LAB_00178c98;
      loop = (uv_process_options_t *)uv_default_loop();
      uv_walk((uv_loop_t *)loop,close_walk_cb,(void *)0x0);
      uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
      puVar5 = uv_default_loop();
      iVar1 = uv_loop_close(puVar5);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return 0;
      }
    }
    else {
      run_test_spawn_setuid_fails_cold_3();
LAB_00178c93:
      run_test_spawn_setuid_fails_cold_4();
LAB_00178c98:
      run_test_spawn_setuid_fails_cold_5();
    }
    run_test_spawn_setuid_fails_cold_6();
LAB_00178ca2:
    run_test_spawn_setuid_fails_cold_7();
LAB_00178ca7:
    run_test_spawn_setuid_fails_cold_1();
  }
  run_test_spawn_setuid_fails_cold_2();
  _Var2 = getuid();
  if (_Var2 == 0) {
    puVar5 = (uv_loop_t *)getpwnam("nobody");
    if (puVar5 == (uv_loop_t *)0x0) goto LAB_00178da7;
    iVar1 = setgid(*(__gid_t *)((long)puVar5->handle_queue + 4));
    loop = (uv_process_options_t *)puVar5;
    if (iVar1 != 0) goto LAB_00178dac;
    iVar1 = setuid(*(__uid_t *)puVar5->handle_queue);
    if (iVar1 == 0) goto LAB_00178cf3;
  }
  else {
LAB_00178cf3:
    init_process_options("spawn_helper1",fail_cb);
    loop = &options;
    options.flags = options.flags | 2;
    options.gid = 0;
    puVar5 = uv_default_loop();
    iVar1 = uv_spawn(puVar5,&process,&options);
    if (iVar1 == -1) {
      puVar5 = uv_default_loop();
      iVar1 = uv_run(puVar5,UV_RUN_DEFAULT);
      if (iVar1 != 0) goto LAB_00178d98;
      if (close_cb_called != 0) goto LAB_00178d9d;
      loop = (uv_process_options_t *)uv_default_loop();
      uv_walk((uv_loop_t *)loop,close_walk_cb,(void *)0x0);
      uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
      puVar5 = uv_default_loop();
      iVar1 = uv_loop_close(puVar5);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return 0;
      }
    }
    else {
      run_test_spawn_setgid_fails_cold_3();
LAB_00178d98:
      run_test_spawn_setgid_fails_cold_4();
LAB_00178d9d:
      run_test_spawn_setgid_fails_cold_5();
    }
    run_test_spawn_setgid_fails_cold_6();
LAB_00178da7:
    run_test_spawn_setgid_fails_cold_7();
LAB_00178dac:
    run_test_spawn_setgid_fails_cold_1();
  }
  run_test_spawn_setgid_fails_cold_2();
  init_process_options("spawn_helper1",(uv_exit_cb)0x0);
  puVar5 = uv_default_loop();
  iVar1 = uv_spawn(puVar5,&process,&options);
  if (iVar1 == 0) {
    puVar5 = uv_default_loop();
    iVar1 = uv_run(puVar5,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_00178e83;
    iVar1 = uv_is_closing((uv_handle_t *)&process);
    if (iVar1 != 0) goto LAB_00178e88;
    uv_close((uv_handle_t *)&process,(uv_close_cb)0x0);
    puVar5 = uv_default_loop();
    iVar1 = uv_run(puVar5,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_00178e8d;
    iVar1 = uv_is_closing((uv_handle_t *)&process);
    if (iVar1 != 1) goto LAB_00178e92;
    loop = (uv_process_options_t *)uv_default_loop();
    uv_walk((uv_loop_t *)loop,close_walk_cb,(void *)0x0);
    uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
    puVar5 = uv_default_loop();
    iVar1 = uv_loop_close(puVar5);
    if (iVar1 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_spawn_auto_unref_cold_1();
LAB_00178e83:
    run_test_spawn_auto_unref_cold_2();
LAB_00178e88:
    run_test_spawn_auto_unref_cold_3();
LAB_00178e8d:
    run_test_spawn_auto_unref_cold_4();
LAB_00178e92:
    run_test_spawn_auto_unref_cold_5();
  }
  run_test_spawn_auto_unref_cold_6();
  acStack_768._0_8_ = 0x6c756e2f7665642f;
  acStack_768[8] = 'l';
  acStack_768[9] = '\0';
  puVar8 = &uStack_638;
  p_Stack_790 = (uv_signal_cb)0x178edb;
  puStack_300 = (uv_loop_t *)loop;
  puStack_2f8 = (uv_loop_t *)loop_01;
  pcStack_2f0 = unaff_R15;
  file = uv_fs_open((uv_loop_t *)0x0,puVar8,acStack_768,2,0,(uv_fs_cb)0x0);
  iVar1 = (int)puVar8;
  if (file == 0xffffffff) {
    p_Stack_790 = (uv_signal_cb)0x17909e;
    run_test_spawn_fs_open_cold_10();
LAB_0017909e:
    p_Stack_790 = (uv_signal_cb)0x1790a3;
    run_test_spawn_fs_open_cold_1();
LAB_001790a3:
    p_Stack_790 = (uv_signal_cb)0x1790a8;
    run_test_spawn_fs_open_cold_2();
LAB_001790a8:
    p_Stack_790 = (uv_signal_cb)0x1790ad;
    run_test_spawn_fs_open_cold_3();
LAB_001790ad:
    p_Stack_790 = (uv_signal_cb)0x1790b2;
    run_test_spawn_fs_open_cold_4();
LAB_001790b2:
    p_Stack_790 = (uv_signal_cb)0x1790b7;
    run_test_spawn_fs_open_cold_5();
LAB_001790b7:
    p_Stack_790 = (uv_signal_cb)0x1790bc;
    run_test_spawn_fs_open_cold_6();
LAB_001790bc:
    p_Stack_790 = (uv_signal_cb)0x1790c1;
    run_test_spawn_fs_open_cold_7();
LAB_001790c1:
    p_Stack_790 = (uv_signal_cb)0x1790c6;
    run_test_spawn_fs_open_cold_8();
  }
  else {
    loop = (uv_process_options_t *)(ulong)file;
    p_Stack_790 = (uv_signal_cb)0x178ef7;
    __fd = uv_get_osfhandle((int)uStack_638.result);
    p_Stack_790 = (uv_signal_cb)0x178f05;
    uStack_77c = __fd;
    uv_fs_req_cleanup(&uStack_638);
    p_Stack_790 = (uv_signal_cb)0x178f18;
    init_process_options("spawn_helper8",exit_cb);
    p_Stack_790 = (uv_signal_cb)0x178f1d;
    puVar5 = uv_default_loop();
    p_Stack_790 = (uv_signal_cb)0x178f2f;
    aVar9.stream = &uStack_740;
    iVar3 = uv_pipe_init(puVar5,&uStack_740,0);
    iVar1 = aVar9.fd;
    if (iVar3 != 0) goto LAB_0017909e;
    options.stdio = &uStack_758;
    uStack_758.flags = UV_READABLE_PIPE|UV_CREATE_PIPE;
    options.stdio_count = 1;
    p_Stack_790 = (uv_signal_cb)0x178f65;
    uStack_758.data.stream = &uStack_740;
    iStack_780 = dup(__fd);
    p_Stack_790 = (uv_signal_cb)0x178f6e;
    puVar5 = uv_default_loop();
    iVar1 = 0x34b410;
    p_Stack_790 = (uv_signal_cb)0x178f80;
    iVar3 = uv_spawn(puVar5,&process,&options);
    if (iVar3 != 0) goto LAB_001790a3;
    p_Stack_790 = (uv_signal_cb)0x178f97;
    uStack_778 = uv_buf_init((char *)&uStack_77c,4);
    puVar10 = &uStack_740;
    p_Stack_790 = (uv_signal_cb)0x178fc4;
    iVar3 = uv_write(&uStack_3c0,puVar10,&uStack_778,1,write_null_cb);
    iVar1 = (int)puVar10;
    if (iVar3 != 0) goto LAB_001790a8;
    p_Stack_790 = (uv_signal_cb)0x178fdb;
    uStack_778 = uv_buf_init((char *)&iStack_780,4);
    puVar10 = &uStack_740;
    p_Stack_790 = (uv_signal_cb)0x179008;
    iVar3 = uv_write(&uStack_480,puVar10,&uStack_778,1,write_cb);
    iVar1 = (int)puVar10;
    if (iVar3 != 0) goto LAB_001790ad;
    p_Stack_790 = (uv_signal_cb)0x179015;
    puVar5 = uv_default_loop();
    iVar1 = 0;
    p_Stack_790 = (uv_signal_cb)0x17901f;
    iVar3 = uv_run(puVar5,UV_RUN_DEFAULT);
    if (iVar3 != 0) goto LAB_001790b2;
    puVar8 = &uStack_638;
    p_Stack_790 = (uv_signal_cb)0x17903a;
    iVar3 = uv_fs_close((uv_loop_t *)0x0,puVar8,file,(uv_fs_cb)0x0);
    iVar1 = (int)puVar8;
    if (iVar3 != 0) goto LAB_001790b7;
    if (exit_cb_called != 1) goto LAB_001790bc;
    if (close_cb_called != 2) goto LAB_001790c1;
    p_Stack_790 = (uv_signal_cb)0x179055;
    loop = (uv_process_options_t *)uv_default_loop();
    p_Stack_790 = (uv_signal_cb)0x179069;
    uv_walk((uv_loop_t *)loop,close_walk_cb,(void *)0x0);
    iVar1 = 0;
    p_Stack_790 = (uv_signal_cb)0x179073;
    uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
    p_Stack_790 = (uv_signal_cb)0x179078;
    puVar5 = uv_default_loop();
    p_Stack_790 = (uv_signal_cb)0x179080;
    iVar3 = uv_loop_close(puVar5);
    if (iVar3 == 0) {
      p_Stack_790 = (uv_signal_cb)0x179089;
      uv_library_shutdown();
      return 0;
    }
  }
  p_Stack_790 = write_null_cb;
  run_test_spawn_fs_open_cold_9();
  if (iVar1 == 0) {
    return extraout_EAX;
  }
  puStack_798 = (uv_loop_t *)run_test_closed_fd_events;
  write_null_cb_cold_1();
  puStack_798 = (uv_loop_t *)loop;
  uStack_a98 = uv_buf_init("",1);
  loop_00 = (uv_process_t *)auStack_aa0;
  req = (code *)0x0;
  iVar1 = uv_pipe((uv_os_fd_t *)loop_00,0,0);
  if (iVar1 == 0) {
    if ((int)auStack_aa0._0_4_ < 3) goto LAB_001793ba;
    if ((int)auStack_aa0._4_4_ < 3) goto LAB_001793bf;
    init_process_options("spawn_helper4",exit_cb);
    options.stdio_count = 3;
    options.stdio = &uStack_a88;
    uStack_a88.flags = UV_INHERIT_FD;
    uStack_a88.data.fd = auStack_aa0._0_4_;
    uStack_a78 = 0;
    uStack_a68 = 0;
    loop_00 = (uv_process_t *)uv_default_loop();
    puVar11 = &process;
    iVar1 = uv_spawn((uv_loop_t *)loop_00,&process,&options);
    req = (code *)puVar11;
    if (iVar1 != 0) goto LAB_001793c4;
    uv_unref((uv_handle_t *)&process);
    loop_00 = (uv_process_t *)uv_default_loop();
    req = (code *)auStack_a58;
    iVar1 = uv_pipe_init((uv_loop_t *)loop_00,(uv_pipe_t *)req,0);
    if (iVar1 != 0) goto LAB_001793c9;
    req = (code *)(ulong)(uint)auStack_aa0._0_4_;
    loop_00 = (uv_process_t *)auStack_a58;
    iVar1 = uv_pipe_open((uv_pipe_t *)loop_00,auStack_aa0._0_4_);
    if (iVar1 != 0) goto LAB_001793ce;
    auStack_aa0._0_4_ = 0xffffffff;
    req = on_alloc;
    loop_00 = (uv_process_t *)auStack_a58;
    iVar1 = uv_read_start((uv_stream_t *)loop_00,on_alloc,on_read_once);
    if (iVar1 != 0) goto LAB_001793d3;
    req = (code *)(auStack_a58 + 0x108);
    loop_00 = (uv_process_t *)0x0;
    iVar1 = uv_fs_write((uv_loop_t *)0x0,(uv_fs_t *)req,auStack_aa0._4_4_,&uStack_a98,1,-1,
                        (uv_fs_cb)0x0);
    if (iVar1 != 1) goto LAB_001793d8;
    if ((uv_loop_s *)auStack_a58._352_8_ != (uv_loop_s *)0x1) goto LAB_001793dd;
    uv_fs_req_cleanup((uv_fs_t *)(auStack_a58 + 0x108));
    loop_00 = (uv_process_t *)uv_default_loop();
    req = (code *)0x1;
    iVar1 = uv_run((uv_loop_t *)loop_00,UV_RUN_ONCE);
    if (iVar1 != 0) goto LAB_001793e2;
    if (output_used != 1) goto LAB_001793e7;
    uv_close((uv_handle_t *)auStack_a58,close_cb);
    req = (code *)(auStack_a58 + 0x108);
    loop_00 = (uv_process_t *)0x0;
    iVar1 = uv_fs_write((uv_loop_t *)0x0,(uv_fs_t *)req,auStack_aa0._4_4_,&uStack_a98,1,-1,
                        (uv_fs_cb)0x0);
    if (iVar1 != 1) goto LAB_001793ec;
    if ((uv_loop_s *)auStack_a58._352_8_ != (uv_loop_s *)0x1) goto LAB_001793f1;
    uv_fs_req_cleanup((uv_fs_t *)(auStack_a58 + 0x108));
    loop_00 = (uv_process_t *)uv_default_loop();
    puVar12 = &timer;
    iVar1 = uv_timer_init((uv_loop_t *)loop_00,&timer);
    req = (code *)puVar12;
    if (iVar1 != 0) goto LAB_001793f6;
    puVar12 = &timer;
    req = timer_counter_cb;
    iVar1 = uv_timer_start(&timer,timer_counter_cb,10,0);
    loop_00 = (uv_process_t *)puVar12;
    if (iVar1 != 0) goto LAB_001793fb;
    loop_00 = (uv_process_t *)uv_default_loop();
    req = (code *)0x1;
    iVar1 = uv_run((uv_loop_t *)loop_00,UV_RUN_ONCE);
    if (iVar1 == 1) {
      loop_00 = (uv_process_t *)uv_default_loop();
      req = (code *)0x1;
      iVar1 = uv_run((uv_loop_t *)loop_00,UV_RUN_ONCE);
      if (iVar1 != 0) goto LAB_00179414;
    }
    if (timer_counter != 1) goto LAB_00179400;
    loop_00 = &process;
    req = (code *)0xf;
    iVar1 = uv_process_kill(&process,0xf);
    if (iVar1 != 0) goto LAB_00179405;
    loop_00 = (uv_process_t *)(ulong)(uint)auStack_aa0._4_4_;
    iVar1 = close(auStack_aa0._4_4_);
    if (iVar1 != 0) goto LAB_0017940a;
    puVar5 = uv_default_loop();
    uv_walk(puVar5,close_walk_cb,(void *)0x0);
    req = (code *)0x0;
    uv_run(puVar5,UV_RUN_DEFAULT);
    loop_00 = (uv_process_t *)uv_default_loop();
    iVar1 = uv_loop_close((uv_loop_t *)loop_00);
    if (iVar1 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_closed_fd_events_cold_1();
LAB_001793ba:
    run_test_closed_fd_events_cold_2();
LAB_001793bf:
    run_test_closed_fd_events_cold_3();
LAB_001793c4:
    run_test_closed_fd_events_cold_4();
LAB_001793c9:
    run_test_closed_fd_events_cold_5();
LAB_001793ce:
    run_test_closed_fd_events_cold_6();
LAB_001793d3:
    run_test_closed_fd_events_cold_7();
LAB_001793d8:
    run_test_closed_fd_events_cold_8();
LAB_001793dd:
    run_test_closed_fd_events_cold_9();
LAB_001793e2:
    run_test_closed_fd_events_cold_10();
LAB_001793e7:
    run_test_closed_fd_events_cold_11();
LAB_001793ec:
    run_test_closed_fd_events_cold_12();
LAB_001793f1:
    run_test_closed_fd_events_cold_13();
LAB_001793f6:
    run_test_closed_fd_events_cold_14();
LAB_001793fb:
    run_test_closed_fd_events_cold_15();
LAB_00179400:
    run_test_closed_fd_events_cold_17();
LAB_00179405:
    run_test_closed_fd_events_cold_18();
LAB_0017940a:
    run_test_closed_fd_events_cold_19();
  }
  run_test_closed_fd_events_cold_20();
LAB_00179414:
  run_test_closed_fd_events_cold_16();
  uv_read_stop((uv_stream_t *)loop_00);
  on_read((uv_stream_t *)loop_00,(ssize_t)req,buf);
  return extraout_EAX_00;
}

Assistant:

TEST_IMPL(spawn_closed_process_io) {
  uv_pipe_t in;
  uv_write_t write_req;
  uv_buf_t buf;
  uv_stdio_container_t stdio[2];
  static char buffer[] = "hello-from-spawn_stdin\n";

  init_process_options("spawn_helper3", exit_cb);

  uv_pipe_init(uv_default_loop(), &in, 0);
  options.stdio = stdio;
  options.stdio[0].flags = UV_CREATE_PIPE | UV_READABLE_PIPE;
  options.stdio[0].data.stream = (uv_stream_t*) &in;
  options.stdio_count = 1;

  close(0); /* Close process stdin. */

  ASSERT(0 == uv_spawn(uv_default_loop(), &process, &options));

  buf = uv_buf_init(buffer, sizeof(buffer));
  ASSERT(0 == uv_write(&write_req, (uv_stream_t*) &in, &buf, 1, write_cb));

  ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT));

  ASSERT(exit_cb_called == 1);
  ASSERT(close_cb_called == 2); /* process, child stdin */

  MAKE_VALGRIND_HAPPY();
  return 0;
}